

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

bool __thiscall anon_unknown.dwarf_42055d::Db::parseSeqId(Db *this,size_t *Out)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  
  pcVar3 = this->First;
  pcVar1 = this->Last;
  bVar5 = true;
  if ((pcVar1 != pcVar3) &&
     ((('/' < *pcVar3 && ((pcVar1 == pcVar3 || (*pcVar3 < ':')))) ||
      ((pcVar1 != pcVar3 && (('@' < *pcVar3 && ((pcVar1 == pcVar3 || (*pcVar3 < '[')))))))))) {
    pcVar3 = this->First;
    bVar5 = pcVar1 == pcVar3;
    if (bVar5) {
      sVar2 = 0;
    }
    else {
      sVar2 = 0;
      do {
        if ((*pcVar3 < '0') || ((!bVar5 && ('9' < *pcVar3)))) {
          if ((bVar5) || ((*pcVar3 < 'A' || ('Z' < *pcVar3)))) break;
          lVar4 = (long)*pcVar3 + -0x37;
        }
        else {
          lVar4 = -0x30;
          if (!bVar5) {
            lVar4 = (long)*pcVar3 + -0x30;
          }
        }
        sVar2 = sVar2 * 0x24 + lVar4;
        pcVar3 = pcVar3 + 1;
        this->First = pcVar3;
        bVar5 = pcVar3 == pcVar1;
      } while (!bVar5);
    }
    *Out = sVar2;
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

char look(unsigned Lookahead = 0) {
    if (static_cast<size_t>(Last - First) <= Lookahead)
      return '\0';
    return First[Lookahead];
  }